

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O2

void BFS(Graph G)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int visited [100];
  int queue [100];
  
  uVar3 = 0;
  uVar7 = 0;
  if (0 < G.vexnum) {
    uVar7 = (ulong)(uint)G.vexnum;
  }
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    visited[uVar3] = 0;
  }
  uVar3 = 0;
  printf("BFS: ");
  iVar11 = 0;
  do {
    if (uVar3 == uVar7) {
      putchar(10);
      return;
    }
    iVar2 = iVar11;
    if (visited[uVar3] == 0) {
      visited[uVar3] = 1;
      putchar((int)G.vexs[uVar3]);
      queue[iVar11] = (int)uVar3;
      iVar2 = iVar11 + 1;
    }
    lVar8 = (long)iVar11;
    iVar11 = iVar2;
    while (iVar11 != (int)lVar8) {
      uVar1 = queue[lVar8];
      uVar4 = 0xffffffff;
      if ((int)uVar1 < G.vexnum && -1 < (int)uVar1) {
        for (uVar4 = 0; (uint)G.vexnum != uVar4; uVar4 = uVar4 + 1) {
          if (G.matrix[uVar1][uVar4] == 1) goto LAB_00101748;
        }
        uVar4 = 0xffffffff;
      }
LAB_00101748:
      lVar8 = lVar8 + 1;
LAB_00101761:
      iVar2 = (int)uVar4;
      if (-1 < iVar2) {
        uVar10 = uVar4 & 0xffffffff;
        uVar12 = uVar4 & 0xffffffff;
        if (visited[uVar12] == 0) {
          visited[uVar12] = 1;
          putchar((int)G.vexs[uVar12]);
          lVar5 = (long)iVar11;
          iVar11 = iVar11 + 1;
          queue[lVar5] = iVar2;
        }
        uVar4 = 0xffffffff;
        if (((-1 < (int)uVar1) && (uVar4 = 0xffffffff, (int)uVar1 < G.vexnum)) &&
           (uVar4 = 0xffffffff, iVar2 < G.vexnum)) {
          piVar6 = G.matrix[uVar1] + uVar12 + 1;
          uVar4 = uVar10;
          do {
            uVar9 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar9;
            if (G.vexnum <= (int)uVar9) {
              uVar4 = 0xffffffff;
              break;
            }
            iVar2 = *piVar6;
            piVar6 = piVar6 + 1;
          } while (iVar2 != 1);
        }
        goto LAB_00101761;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void BFS(Graph G){
    int head = 0;
    int rear = 0;
    int queue[MAX]; //辅助队列
    int visited[MAX];   //顶点访问标记
    int i,j,k;
    for(i = 0;i < G.vexnum; i++){   //初始化访问数组
        visited[i] = 0;
    }
    printf("BFS: ");
    for(i = 0;i < G.vexnum;i++){
        if(!visited[i]){
            visited[i] = 1;
            printf("%c",G.vexs[i]);
            queue[rear++] = i;  //入队列
        }
        while (head != rear){
            j = queue[head++];  //出队列
            for(k  = first_vertex(G,j); k >= 0;k = next_vertix(G,j,k))   //k是访问的邻接结点
            {
                if(!visited[k]){
                    visited[k] = 1;
                    printf("%c",G.vexs[k]);
                    queue[rear++] = k;
                }
            }
        }
    }
    printf("\n");
}